

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall CLI::BadNameString::BadNameString(BadNameString *this,string *msg)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"BadNameString",&local_51);
  ::std::__cxx11::string::string((string *)&local_50,(string *)msg);
  BadNameString(this,&local_30,&local_50,BadNameString);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static BadNameString DashesOnly(std::string name) {
        return BadNameString("Must have a name, not just dashes: " + name);
    }